

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

vector<double,_std::allocator<double>_> *
mult_matrix<double>(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *a,vector<double,_std::allocator<double>_> *b)

{
  pointer pdVar1;
  pointer pvVar2;
  long lVar3;
  pointer pdVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  double dVar10;
  allocator_type local_39;
  pointer local_38;
  
  uVar9 = ((long)(a->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(a->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  local_38 = (b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
  pdVar1 = (b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  iVar8 = (int)uVar9;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,(long)iVar8,&local_39)
  ;
  if (0 < iVar8) {
    uVar5 = (ulong)((long)pdVar1 - (long)local_38) >> 3;
    pvVar2 = (a->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 0;
    do {
      if (0 < (int)uVar5) {
        lVar3 = *(long *)&pvVar2[uVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        pdVar4 = (b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar10 = pdVar1[uVar6];
        uVar7 = 0;
        do {
          dVar10 = dVar10 + *(double *)(lVar3 + uVar7 * 8) * pdVar4[uVar7];
          pdVar1[uVar6] = dVar10;
          uVar7 = uVar7 + 1;
        } while ((uVar5 & 0x7fffffff) != uVar7);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uVar9 & 0x7fffffff));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> mult_matrix(const std::vector<std::vector<T> >& a, std::vector<T> b){
    int n = a.size();
    int m = b.size();
    std::vector<T> ans(n);
    for (int i = 0; i < n; ++i)
            for (int x = 0; x < m; ++x)
                ans[i] += a[i][x]*b[x];
    return ans;
}